

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTcPrsOpUnary::parse(CTcPrsOpUnary *this)

{
  tc_toktyp_t tVar1;
  CTcPrsNode *subexpr;
  CTcTokenizer *this_00;
  undefined8 *in_RDI;
  CTcPrsNode *sub;
  tc_toktyp_t op;
  CTcPrsNode *in_stack_00000048;
  CTcPrsOpUnary *in_stack_00000058;
  undefined4 in_stack_ffffffffffffffe8;
  CTcPrsNode *local_8;
  
  tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x256a72);
  this_00 = (CTcTokenizer *)(ulong)(tVar1 - TOKT_PLUS);
  switch(this_00) {
  case (CTcTokenizer *)0x0:
  case (CTcTokenizer *)0x1:
  case (CTcTokenizer *)0x15:
  case (CTcTokenizer *)0x16:
  case (CTcTokenizer *)0x22:
  case (CTcTokenizer *)0x23:
  case (CTcTokenizer *)0x4c:
    CTcTokenizer::next(this_00);
    subexpr = (CTcPrsNode *)(**(code **)*in_RDI)();
    if (subexpr == (CTcPrsNode *)0x0) {
      local_8 = (CTcPrsNode *)0x0;
    }
    else if (tVar1 == TOKT_PLUS) {
      local_8 = parse_pos((CTcPrsNode *)this_00);
    }
    else if (tVar1 == TOKT_MINUS) {
      local_8 = parse_neg(in_stack_00000048);
    }
    else if (tVar1 == TOKT_INC) {
      local_8 = parse_inc(0x33,subexpr);
    }
    else if (tVar1 == TOKT_DEC) {
      local_8 = parse_dec(0x34,subexpr);
    }
    else if (tVar1 == TOKT_NOT) {
      local_8 = parse_not((CTcPrsNode *)CONCAT44(0x40,in_stack_ffffffffffffffe8));
    }
    else if (tVar1 == TOKT_BNOT) {
      local_8 = parse_bnot((CTcPrsNode *)CONCAT44(0x41,in_stack_ffffffffffffffe8));
    }
    else if (tVar1 == TOKT_DELETE) {
      local_8 = parse_delete(subexpr);
    }
    else {
      local_8 = (CTcPrsNode *)0x0;
    }
    break;
  default:
    local_8 = parse_postfix(0,tVar1 - TOKT_PLUS);
    break;
  case (CTcTokenizer *)0xd:
    CTcTokenizer::next(this_00);
    local_8 = parse_addr(in_stack_00000058);
  }
  return local_8;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse() const
{
    /* get the current token, which may be a prefix operator */
    tc_toktyp_t op = G_tok->cur();

    /* check for prefix operators */
    switch(op)
    {
    case TOKT_AND:
        /* skip the '&' */
        G_tok->next();
        
        /* parse the address expression */
        return parse_addr();

    case TOKT_NOT:
    case TOKT_BNOT:
    case TOKT_PLUS:
    case TOKT_MINUS:
    case TOKT_INC:
    case TOKT_DEC:
    case TOKT_DELETE:
        {
            /* skip the operator */
            G_tok->next();
            
            /* 
             *   recursively parse the unary expression to which to apply the
             *   operator 
             */
            CTcPrsNode *sub = parse();
            if (sub == 0)
                return 0;
            
            /* apply the operator */
            switch(op)
            {
            case TOKT_NOT:
                /* apply the NOT operator */
                return parse_not(sub);
                
            case TOKT_BNOT:
                /* apply the bitwise NOT operator */
                return parse_bnot(sub);
                
            case TOKT_PLUS:
                /* apply the unary positive operator */
                return parse_pos(sub);
                
            case TOKT_MINUS:
                /* apply the unary negation operator */
                return parse_neg(sub);
                
            case TOKT_INC:
                /* apply the pre-increment operator */
                return parse_inc(TRUE, sub);
                
            case TOKT_DEC:
                /* apply the pre-decrement operator */
                return parse_dec(TRUE, sub);
                
            case TOKT_DELETE:
                /* apply the deletion operator */
                return parse_delete(sub);
                
            default:
                /* 
                 *   we shouldn't ever get here, since this switch should
                 *   contain every case that brought us into it in the first
                 *   place
                 */
                return 0;
            }
        }

    default:
        /* it's not a unary prefix operator - parse a postfix expression */
        return parse_postfix(TRUE, TRUE);
    }
}